

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CordInputStream::ReadCord(CordInputStream *this,Cord *cord,int count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Cord local_40;
  
  absl::lts_20240722::Cord::ChunkIterator::AdvanceBytes
            (&(this->it_).chunk_iterator_,this->size_ - this->available_);
  uVar2 = (ulong)count;
  uVar1 = this->bytes_remaining_;
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    uVar3 = uVar1;
  }
  absl::lts_20240722::Cord::ChunkIterator::AdvanceAndReadBytes((ulong)&local_40);
  absl::lts_20240722::Cord::Append(cord);
  absl::lts_20240722::Cord::~Cord(&local_40);
  this->bytes_remaining_ = this->bytes_remaining_ - uVar3;
  LoadChunkData(this);
  return uVar2 <= uVar1;
}

Assistant:

bool CordInputStream::ReadCord(absl::Cord* cord, int count) {
  // Advance the iterator to the current position
  const size_t used = size_ - available_;
  absl::Cord::Advance(&it_, used);

  // Read the cord, adjusting the iterator position.
  // Make sure to cap at available bytes to avoid hard crashes.
  const size_t n = std::min(static_cast<size_t>(count), bytes_remaining_);
  cord->Append(absl::Cord::AdvanceAndRead(&it_, n));

  // Update current chunk data.
  bytes_remaining_ -= n;
  LoadChunkData();

  return n == static_cast<size_t>(count);
}